

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O2

void __thiscall
absl::lts_20240722::log_internal::LogToSinks
          (log_internal *this,LogEntry *entry,Span<absl::lts_20240722::LogSink_*> extra_sinks,
          bool extra_sinks_only)

{
  char *pcVar1;
  size_type sVar2;
  Span<absl::lts_20240722::LogSink_*> sinks;
  Span<absl::lts_20240722::LogSink_*> sinks_00;
  ReaderMutexLock local_28;
  
  sVar2 = extra_sinks.len_;
  sinks.ptr_ = extra_sinks.ptr_;
  anon_unknown_0::GlobalSinks();
  sinks.len_ = sVar2;
  anon_unknown_0::GlobalLogSinkSet::SendToSinks((GlobalLogSinkSet *)this,entry,sinks);
  if ((int)extra_sinks.len_ == 0) {
    pcVar1 = (char *)__tls_get_addr(&PTR_00106fc8);
    if (*pcVar1 == '\x01') {
      absl::lts_20240722::log_internal::WriteToStderr
                (*(long *)(this + 0x48) + -1,*(undefined8 *)(this + 0x40),
                 *(undefined4 *)(this + 0x28));
      return;
    }
    local_28.mu_ = (Mutex *)&anon_unknown_0::GlobalSinks::global_sinks;
    absl::lts_20240722::Mutex::ReaderLock();
    *pcVar1 = '\x01';
    sinks_00.ptr_ =
         (pointer)((long)(anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_ -
                         anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._8_8_) >> 3);
    sinks_00.len_ = sVar2;
    anon_unknown_0::GlobalLogSinkSet::SendToSinks
              ((GlobalLogSinkSet *)this,
               (LogEntry *)anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._8_8_,sinks_00);
    *pcVar1 = '\0';
    ReaderMutexLock::~ReaderMutexLock(&local_28);
  }
  return;
}

Assistant:

void LogToSinks(const absl::LogEntry& entry,
                absl::Span<absl::LogSink*> extra_sinks, bool extra_sinks_only) {
  log_internal::GlobalSinks().LogToSinks(entry, extra_sinks, extra_sinks_only);
}